

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::coTest(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *__return_storage_ptr__,
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,int i,Status stat)

{
  bool *pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int32_t iVar9;
  int iVar10;
  cpp_dec_float<100U,_int,_void> *pcVar11;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<100U,_int,_void> *pcVar12;
  type t;
  cpp_dec_float<100U,_int,_void> local_c8;
  cpp_dec_float<100U,_int,_void> local_78;
  
  local_c8.fpclass = cpp_dec_float_finite;
  local_c8.prec_elem = 0x10;
  local_c8.data._M_elems[0] = 0;
  local_c8.data._M_elems[1] = 0;
  local_c8.data._M_elems[2] = 0;
  local_c8.data._M_elems[3] = 0;
  local_c8.data._M_elems[4] = 0;
  local_c8.data._M_elems[5] = 0;
  local_c8.data._M_elems[6] = 0;
  local_c8.data._M_elems[7] = 0;
  local_c8.data._M_elems[8] = 0;
  local_c8.data._M_elems[9] = 0;
  local_c8.data._M_elems[10] = 0;
  local_c8.data._M_elems[0xb] = 0;
  local_c8.data._M_elems[0xc] = 0;
  local_c8.data._M_elems[0xd] = 0;
  local_c8.data._M_elems._56_5_ = 0;
  local_c8.data._M_elems[0xf]._1_3_ = 0;
  local_c8.exp = 0;
  local_c8.neg = false;
  switch(stat) {
  case D_FREE:
  case D_ON_BOTH:
    pcVar11 = &(this->theCoPvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    pcVar12 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    local_78.fpclass = cpp_dec_float_finite;
    local_78.prec_elem = 0x10;
    local_78.data._M_elems[0] = 0;
    local_78.data._M_elems[1] = 0;
    local_78.data._M_elems[2] = 0;
    local_78.data._M_elems[3] = 0;
    local_78.data._M_elems[4] = 0;
    local_78.data._M_elems[5] = 0;
    local_78.data._M_elems[6] = 0;
    local_78.data._M_elems[7] = 0;
    local_78.data._M_elems[8] = 0;
    local_78.data._M_elems[9] = 0;
    local_78.data._M_elems[10] = 0;
    local_78.data._M_elems[0xb] = 0;
    local_78.data._M_elems[0xc] = 0;
    local_78.data._M_elems[0xd] = 0;
    local_78.data._M_elems._56_5_ = 0;
    local_78.data._M_elems[0xf]._1_3_ = 0;
    local_78.exp = 0;
    local_78.neg = false;
    if (&local_78 == pcVar12) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=(&local_78,pcVar11)
      ;
      if (local_78.data._M_elems[0] != 0 || local_78.fpclass != cpp_dec_float_finite) {
        local_78.neg = (bool)(local_78.neg ^ 1);
      }
    }
    else {
      if (&local_78 != pcVar11) {
        local_78.data._M_elems._0_8_ = *(undefined8 *)(pcVar11->data)._M_elems;
        local_78.data._M_elems._8_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 2);
        local_78.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
        local_78.data._M_elems._24_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 6);
        local_78.data._M_elems._32_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
        local_78.data._M_elems._40_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 10);
        local_78.data._M_elems._48_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 0xc);
        uVar2 = *(undefined8 *)((pcVar11->data)._M_elems + 0xe);
        local_78.data._M_elems._56_5_ = SUB85(uVar2,0);
        local_78.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
        local_78.exp = pcVar11->exp;
        local_78.neg = pcVar11->neg;
        local_78.fpclass = pcVar11->fpclass;
        local_78.prec_elem = pcVar11->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=(&local_78,pcVar12)
      ;
    }
    local_c8.data._M_elems[0xc] = local_78.data._M_elems[0xc];
    local_c8.data._M_elems[0xd] = local_78.data._M_elems[0xd];
    local_c8.data._M_elems._56_5_ = local_78.data._M_elems._56_5_;
    local_c8.data._M_elems[0xf]._1_3_ = local_78.data._M_elems[0xf]._1_3_;
    local_c8.data._M_elems[8] = local_78.data._M_elems[8];
    local_c8.data._M_elems[9] = local_78.data._M_elems[9];
    local_c8.data._M_elems[10] = local_78.data._M_elems[10];
    local_c8.data._M_elems[0xb] = local_78.data._M_elems[0xb];
    local_c8.data._M_elems[4] = local_78.data._M_elems[4];
    local_c8.data._M_elems[5] = local_78.data._M_elems[5];
    local_c8.data._M_elems[6] = local_78.data._M_elems[6];
    local_c8.data._M_elems[7] = local_78.data._M_elems[7];
    local_c8.data._M_elems[0] = local_78.data._M_elems[0];
    local_c8.data._M_elems[1] = local_78.data._M_elems[1];
    local_c8.data._M_elems[2] = local_78.data._M_elems[2];
    local_c8.data._M_elems[3] = local_78.data._M_elems[3];
    local_c8.exp = local_78.exp;
    local_c8.neg = local_78.neg;
    local_c8.fpclass = local_78.fpclass;
    local_c8.prec_elem = local_78.prec_elem;
    if (local_78.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_78,0,(type *)0x0);
      iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_c8,&local_78);
      if (iVar10 < 0) {
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
             local_c8.data._M_elems._48_8_;
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
             CONCAT35(local_c8.data._M_elems[0xf]._1_3_,local_c8.data._M_elems._56_5_);
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             local_c8.data._M_elems._32_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
             local_c8.data._M_elems._40_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             local_c8.data._M_elems._16_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             local_c8.data._M_elems._24_8_;
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
             local_c8.data._M_elems._0_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             local_c8.data._M_elems._8_8_;
        (__return_storage_ptr__->m_backend).exp = local_c8.exp;
        (__return_storage_ptr__->m_backend).neg = local_c8.neg;
        (__return_storage_ptr__->m_backend).fpclass = local_c8.fpclass;
        (__return_storage_ptr__->m_backend).prec_elem = local_c8.prec_elem;
        return __return_storage_ptr__;
      }
    }
    goto LAB_003bc826;
  case D_ON_UPPER:
    pcVar11 = &(this->theCoPvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    pcVar12 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    break;
  case D_ON_LOWER:
LAB_003bc826:
    pcVar11 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    pcVar12 = &(this->theCoPvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
    (__return_storage_ptr__->m_backend).prec_elem = 0x10;
    goto LAB_003bc850;
  case P_ON_LOWER:
    pcVar11 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    pcVar12 = &(this->theCoPvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    break;
  default:
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (&__return_storage_ptr__->m_backend,0,(type *)0x0);
    return __return_storage_ptr__;
  case P_ON_UPPER:
    pcVar11 = &(this->theCoPvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    pcVar12 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
  }
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x10;
LAB_003bc850:
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x3d) = 0;
  if (pcVar12 == &__return_storage_ptr__->m_backend) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              (&__return_storage_ptr__->m_backend,pcVar11);
    if ((__return_storage_ptr__->m_backend).data._M_elems[0] != 0 ||
        (__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_finite) {
      pbVar1 = &(__return_storage_ptr__->m_backend).neg;
      *pbVar1 = (bool)(*pbVar1 ^ 1);
    }
  }
  else {
    if (pcVar11 != &__return_storage_ptr__->m_backend) {
      uVar2 = *(undefined8 *)(pcVar11->data)._M_elems;
      uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 2);
      uVar4 = *(undefined8 *)((pcVar11->data)._M_elems + 4);
      uVar5 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
      uVar6 = *(undefined8 *)((pcVar11->data)._M_elems + 8);
      uVar7 = *(undefined8 *)((pcVar11->data)._M_elems + 10);
      uVar8 = *(undefined8 *)((pcVar11->data)._M_elems + 0xe);
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
           *(undefined8 *)((pcVar11->data)._M_elems + 0xc);
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) = uVar8;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) = uVar6;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) = uVar7;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) = uVar4;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar5;
      *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = uVar2;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar3;
      (__return_storage_ptr__->m_backend).exp = pcVar11->exp;
      (__return_storage_ptr__->m_backend).neg = pcVar11->neg;
      iVar9 = pcVar11->prec_elem;
      (__return_storage_ptr__->m_backend).fpclass = pcVar11->fpclass;
      (__return_storage_ptr__->m_backend).prec_elem = iVar9;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              (&__return_storage_ptr__->m_backend,pcVar12);
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::coTest(int i, typename SPxBasisBase<R>::Desc::Status stat) const
{
   assert(type() == ENTER);
   assert(!isBasic(stat));

   R x;

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_BOTH :
      assert(rep() == ROW);
      x = (*theCoPvec)[i] - SPxLPBase<R>::lower(i);

      if(x < 0)
         return x;

   // no break: next is else case
   //lint -fallthrough
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
      assert(rep() == ROW);
      return SPxLPBase<R>::upper(i) - (*theCoPvec)[i];

   case SPxBasisBase<R>::Desc::D_ON_UPPER:
      assert(rep() == ROW);
      return (*theCoPvec)[i] - SPxLPBase<R>::lower(i);

   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      assert(rep() == COLUMN);
      return (*theCoPvec)[i] - this->maxRowObj(i);             // slacks !

   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      assert(rep() == COLUMN);
      return this->maxRowObj(i) - (*theCoPvec)[i];             // slacks !

   default:
      return 0;
   }
}